

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

Entry * kj::_::
        CopyConstructArray_<kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry,_kj::HashMap<capnp::_::RawSchema_*,_kj::Vector<capnp::_::RawSchema_*>_>::Entry_*,_true,_false>
        ::apply(Entry *pos,Entry *start,Entry *end)

{
  size_t sVar1;
  undefined4 uVar2;
  ExceptionGuard local_18;
  
  if (start != end) {
    do {
      sVar1 = (start->key).super_StringPtr.content.size_;
      (pos->key).super_StringPtr.content.ptr = (start->key).super_StringPtr.content.ptr;
      (pos->key).super_StringPtr.content.size_ = sVar1;
      uVar2 = *(undefined4 *)&start->field_0x14;
      pos->value = start->value;
      *(undefined4 *)&pos->field_0x14 = uVar2;
      pos[1].key.super_StringPtr.content.ptr = start[1].key.super_StringPtr.content.ptr;
      pos[1].key.super_StringPtr.content.size_ = start[1].key.super_StringPtr.content.size_;
      (start->key).super_StringPtr.content.size_ = 0;
      *(undefined8 *)&start->value = 0;
      start[1].key.super_StringPtr.content.ptr = (char *)0x0;
      start = (Entry *)&start[1].value;
      pos = (Entry *)&pos[1].value;
    } while (start != end);
  }
  local_18.start = pos;
  local_18.pos = pos;
  ExceptionGuard::~ExceptionGuard(&local_18);
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }